

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

void plot(double n)

{
  double in_XMM0_Qa;
  char x;
  int n3;
  double n2;
  char local_15;
  double local_10;
  
  local_10 = in_XMM0_Qa * 1.0;
  if (local_10 < 0.0) {
    local_10 = 0.0;
  }
  local_10 = local_10 * 100.0;
  if (64.0 < local_10) {
    local_10 = 64.0;
  }
  if ((int)local_10 == 0) {
    printf(".");
  }
  else {
    local_15 = (char)(int)local_10 + '0';
    if ('9' < local_15) {
      local_15 = 'X';
    }
    printf("%c",(ulong)(uint)(int)local_15);
  }
  return;
}

Assistant:

void plot ( double n )
{
  double n2 = n * 1;

  if(n2 < 0) n2 = 0;

  n2 *= 100;

  if(n2 > 64) n2 = 64;

  int n3 = (int)n2;

  if(n3 == 0)
    printf(".");
  else
  {
    char x = '0' + char(n3);

    if(x > '9') x = 'X';

    printf("%c",x);
  }
}